

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O2

Status __thiscall
leveldb::TableCache::FindTable
          (TableCache *this,uint64_t file_number,uint64_t file_size,Handle **handle)

{
  Status SVar1;
  _Alloc_hider _Var2;
  long lVar3;
  undefined8 *puVar4;
  long *in_R8;
  char *__tmp;
  RandomAccessFile *file;
  Table *table;
  long *local_a0;
  Handle **local_98;
  Status local_90;
  string old_fname;
  Slice key;
  char buf [8];
  string fname;
  
  this->env_ = (Env *)0x0;
  key.data_ = buf;
  key.size_ = 8;
  buf = (char  [8])file_size;
  lVar3 = (**(code **)(**(long **)(file_number + 0x30) + 0x18))();
  *in_R8 = lVar3;
  if (lVar3 != 0) {
    return (Status)(char *)this;
  }
  local_a0 = in_R8;
  local_98 = handle;
  TableFileName(&fname,(string *)(file_number + 8),file_size);
  file = (RandomAccessFile *)0x0;
  table = (Table *)0x0;
  (**(code **)(**(long **)file_number + 0x18))(&old_fname,*(long **)file_number,&fname);
  _Var2 = old_fname._M_dataplus;
  this->env_ = (Env *)old_fname._M_dataplus._M_p;
  old_fname._M_dataplus._M_p = (pointer)0x0;
  Status::~Status((Status *)&old_fname);
  if (_Var2._M_p == (pointer)0x0) {
LAB_0011a071:
    Table::Open((Table *)&old_fname,*(Options **)(file_number + 0x28),file,(uint64_t)local_98,&table
               );
    _Var2 = old_fname._M_dataplus;
    this->env_ = (Env *)old_fname._M_dataplus._M_p;
    old_fname._M_dataplus._M_p = (pointer)0x0;
    Status::~Status((Status *)&old_fname);
    if (_Var2._M_p == (pointer)0x0) {
      puVar4 = (undefined8 *)operator_new(0x10);
      *puVar4 = file;
      puVar4[1] = table;
      lVar3 = (**(code **)(**(long **)(file_number + 0x30) + 0x10))
                        (*(long **)(file_number + 0x30),&key,puVar4,1,DeleteEntry);
      *local_a0 = lVar3;
      goto LAB_0011a100;
    }
  }
  else {
    SSTTableFileName(&old_fname,(string *)(file_number + 8),file_size);
    (**(code **)(**(long **)file_number + 0x18))(&local_90,*(long **)file_number,&old_fname,&file);
    SVar1.state_ = local_90.state_;
    Status::~Status(&local_90);
    if (SVar1.state_ == (pointer)0x0) {
      local_90.state_ = _Var2._M_p;
      Status::~Status(&local_90);
      std::__cxx11::string::_M_dispose();
      goto LAB_0011a071;
    }
    std::__cxx11::string::_M_dispose();
  }
  if (table != (Table *)0x0) {
    __assert_fail("table == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/table_cache.cc"
                  ,0x40,
                  "Status leveldb::TableCache::FindTable(uint64_t, uint64_t, Cache::Handle **)");
  }
  if (file != (RandomAccessFile *)0x0) {
    (*file->_vptr_RandomAccessFile[1])();
  }
LAB_0011a100:
  std::__cxx11::string::_M_dispose();
  return (Status)(char *)this;
}

Assistant:

Status TableCache::FindTable(uint64_t file_number, uint64_t file_size,
                             Cache::Handle** handle) {
  Status s;
  char buf[sizeof(file_number)];
  EncodeFixed64(buf, file_number);
  Slice key(buf, sizeof(buf));
  *handle = cache_->Lookup(key);
  if (*handle == nullptr) {
    std::string fname = TableFileName(dbname_, file_number);
    RandomAccessFile* file = nullptr;
    Table* table = nullptr;
    s = env_->NewRandomAccessFile(fname, &file);
    if (!s.ok()) {
      std::string old_fname = SSTTableFileName(dbname_, file_number);
      if (env_->NewRandomAccessFile(old_fname, &file).ok()) {
        s = Status::OK();
      }
    }
    if (s.ok()) {
      s = Table::Open(options_, file, file_size, &table);
    }

    if (!s.ok()) {
      assert(table == nullptr);
      delete file;
      // We do not cache error results so that if the error is transient,
      // or somebody repairs the file, we recover automatically.
    } else {
      TableAndFile* tf = new TableAndFile;
      tf->file = file;
      tf->table = table;
      *handle = cache_->Insert(key, tf, 1, &DeleteEntry);
    }
  }
  return s;
}